

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_utils.cc
# Opt level: O2

vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *
discoverWithFilter(vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   *__return_storage_ptr__,DeviceFilter *filter)

{
  pointer pDVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  DeviceInfo *extraout_RDX;
  DeviceInfo *extraout_RDX_00;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  _Var5;
  DeviceInfo *extraout_RDX_01;
  DeviceInfo *extraout_RDX_02;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *__range1;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  __it1;
  DeviceInfo *this;
  DeviceInfo *info;
  const_iterator __first;
  pointer device_info;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> infos;
  Discover discover;
  
  rcdiscover::Discover::Discover(&discover);
  rcdiscover::Discover::broadcastRequest(&discover);
  lVar3 = std::chrono::_V2::steady_clock::now();
  infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar4 = lVar3;
  while ((bVar2 = rcdiscover::Discover::getResponse(&discover,&infos,100), bVar2 ||
         ((double)(lVar4 - lVar3) / 1000000.0 < 1000.0))) {
    lVar4 = std::chrono::_V2::steady_clock::now();
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (infos.
             super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
             _M_impl.super__Vector_impl_data._M_start,
             infos.
             super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  __first._M_current =
       infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  _Var5._M_current = extraout_RDX;
  __it1._M_current =
       infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if (infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this = __it1._M_current;
      __it1._M_current = this + 1;
      if (__it1._M_current == __first._M_current) goto LAB_001142eb;
      bVar2 = __gnu_cxx::__ops::_Iter_comp_iter<discoverWithFilter(DeviceFilter_const&)::$_0>::
              operator()(this,__it1,_Var5);
      _Var5._M_current = extraout_RDX_00;
    } while (!bVar2);
    while (__it1._M_current = __it1._M_current + 1, __it1._M_current != __first._M_current) {
      bVar2 = __gnu_cxx::__ops::_Iter_comp_iter<discoverWithFilter(DeviceFilter_const&)::$_0>::
              operator()(this,__it1,_Var5);
      _Var5._M_current = extraout_RDX_01;
      if (!bVar2) {
        this = this + 1;
        rcdiscover::DeviceInfo::operator=(this,__it1._M_current);
        _Var5._M_current = extraout_RDX_02;
      }
    }
    __first._M_current = this + 1;
  }
LAB_001142eb:
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::erase
            (&infos,__first,
             (const_iterator)
             infos.
             super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  pDVar1 = infos.super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (device_info = infos.
                     super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start; device_info != pDVar1;
      device_info = device_info + 1) {
    bVar2 = filterDevice(device_info,filter);
    if (bVar2) {
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::push_back
                (__return_storage_ptr__,device_info);
    }
  }
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector(&infos);
  rcdiscover::Discover::~Discover(&discover);
  return __return_storage_ptr__;
}

Assistant:

std::vector<rcdiscover::DeviceInfo> discoverWithFilter(
    const DeviceFilter &filter)
{
  rcdiscover::Discover discover;
  discover.broadcastRequest();

  std::chrono::steady_clock::time_point tstart=std::chrono::steady_clock::now();
  std::chrono::steady_clock::time_point tend=tstart;

  std::vector<rcdiscover::DeviceInfo> infos;
  while (discover.getResponse(infos, 100) ||
    std::chrono::duration<double, std::milli>(tend-tstart).count() < 1000)
  {
    tend=std::chrono::steady_clock::now();
  }

  std::sort(infos.begin(), infos.end());
  infos.erase(std::unique(infos.begin(), infos.end(),
                          [](const rcdiscover::DeviceInfo &lhs,
                             const rcdiscover::DeviceInfo &rhs)
                          {
                            return lhs.getMAC() == rhs.getMAC() &&
                                   lhs.getIfaceName() == rhs.getIfaceName();
                          }), infos.end());

  std::vector<rcdiscover::DeviceInfo> filtered_devices;
  for (const auto &info : infos)
  {
    if (filterDevice(info, filter))
    {
      filtered_devices.push_back(info);
    }
  }
  return filtered_devices;
}